

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRStereoNode::setCameraMatrix(VRStereoNode *this,VRDataIndex *renderState,VREyePosition eye)

{
  byte bVar1;
  VRAnyCoreType __s;
  undefined8 uVar2;
  int in_EDX;
  string *in_RSI;
  VRMatrix4 *in_RDI;
  VRMatrix4 cameraMatrix;
  VRMatrix4 headMatrix;
  VRMatrix4 *in_stack_fffffffffffffb98;
  VRMatrix4 *in_stack_fffffffffffffba0;
  float zz;
  undefined8 in_stack_fffffffffffffba8;
  float xx;
  VRVector3 *in_stack_fffffffffffffbb0;
  VRMatrix4 *in_stack_fffffffffffffbb8;
  VRAnyCoreType in_stack_fffffffffffffbc0;
  allocator<char> *in_stack_fffffffffffffbd0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *psVar3;
  string *psVar4;
  undefined7 in_stack_fffffffffffffbf8;
  VRMatrix4 *m2;
  VRDataIndex *in_stack_fffffffffffffc20;
  string local_3d8 [32];
  string local_3b8 [32];
  VRVector3 local_398;
  VRMatrix4 local_380;
  VRMatrix4 local_338;
  VRVector3 local_2f0;
  VRMatrix4 local_2d8;
  string *in_stack_fffffffffffffda8;
  int *in_stack_fffffffffffffdb0;
  VRFloatArrayConvertible in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  VRError *in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdf7;
  string *in_stack_fffffffffffffdf8;
  undefined6 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  VRDataIndex *in_stack_fffffffffffffe08;
  allocator<char> local_181 [40];
  undefined1 local_159 [40];
  undefined1 local_131 [33];
  VRDatum_conflict *local_110;
  VRMatrix4 local_108;
  undefined1 local_b9 [56];
  undefined1 local_81 [33];
  VRMatrix4 local_60;
  int local_14;
  string *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  VRMatrix4::VRMatrix4(in_stack_fffffffffffffba0);
  psVar4 = (string *)local_81;
  psVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  m2 = (VRMatrix4 *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  bVar1 = VRDataIndex::exists(in_stack_fffffffffffffc20,psVar4,psVar3,SUB81((ulong)in_RDI >> 0x38,0)
                             );
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  if ((bVar1 & 1) != 0) {
    psVar4 = (string *)local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    __s = VRDataIndex::getValue
                    (in_stack_fffffffffffffe08,
                     (string *)
                     CONCAT17(in_stack_fffffffffffffe07,
                              CONCAT16(in_stack_fffffffffffffe06,in_stack_fffffffffffffe00)),
                     in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
    local_110 = __s.datum;
    VRMatrix4::VRMatrix4(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0);
    VRMatrix4::operator=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    VRMatrix4::~VRMatrix4(&local_108);
    std::__cxx11::string::~string((string *)(local_159 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_159);
    std::__cxx11::string::~string((string *)(local_131 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_131);
    VRMatrix4::VRMatrix4(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    zz = (float)((ulong)in_stack_fffffffffffffba0 >> 0x20);
    xx = (float)((ulong)in_stack_fffffffffffffba8 >> 0x20);
    if (local_14 == 1) {
      VRVector3::VRVector3(in_stack_fffffffffffffbb0,xx,(float)in_stack_fffffffffffffba8,zz);
      VRMatrix4::translation((VRVector3 *)local_10);
      MinVR::operator*(in_RDI,m2);
      VRMatrix4::operator=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffffd70);
      VRMatrix4::~VRMatrix4(&local_2d8);
      VRVector3::~VRVector3(&local_2f0);
      psVar3 = local_10;
    }
    else {
      psVar3 = local_10;
      if (local_14 == 2) {
        VRVector3::VRVector3(in_stack_fffffffffffffbb0,xx,(float)in_stack_fffffffffffffba8,zz);
        VRMatrix4::translation((VRVector3 *)local_10);
        MinVR::operator*(in_RDI,m2);
        VRMatrix4::operator=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        VRMatrix4::~VRMatrix4(&local_338);
        VRMatrix4::~VRMatrix4(&local_380);
        VRVector3::~VRVector3(&local_398);
        psVar3 = local_10;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__s.datum,in_stack_fffffffffffffbd0);
    VRDataIndex::addData
              ((VRDataIndex *)CONCAT17(bVar1,in_stack_fffffffffffffbf8),psVar4,
               (VRFloatArrayConvertible *)psVar3);
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc27);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffffdb8);
    VRMatrix4::~VRMatrix4(&local_60);
    return;
  }
  uVar2 = __cxa_allocate_exception(0xa8);
  __a = local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,__a);
  VRError::VRError(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                   (string *)in_stack_fffffffffffffdb8._vptr_VRFloatArrayConvertible,
                   in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  __cxa_throw(uVar2,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

void VRStereoNode::setCameraMatrix(VRDataIndex *renderState, VREyePosition eye)
{

    // This should be set by a HeadTrackingNode or a LookAtNode before reaching
    // this StereoNode
	VRMatrix4 headMatrix;
	if (renderState->exists("HeadMatrix")) {
		headMatrix = renderState->getValue("HeadMatrix");

	} else {
    VRERROR("VRStereoNode cannot find HeadMatrix in the current RenderState",
            "The display graph should include a VRHeadTrackingNode or a "
            "VRLookAtNode or some other method of defining a HeadMatrix "
            "before reaching the VRStereoNode.");
  }

  VRMatrix4 cameraMatrix = headMatrix;
  if (eye == Left) {
    cameraMatrix = cameraMatrix * VRMatrix4::translation(VRVector3(-_iod / 2.0f, 0, 0));
	} else if (eye == Right) {
    cameraMatrix = cameraMatrix * VRMatrix4::translation(VRVector3(_iod / 2.0f, 0, 0));
	}

	renderState->addData("CameraMatrix", cameraMatrix);
}